

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecInt.h
# Opt level: O1

Vec_Int_t * Vec_IntDup(Vec_Int_t *pVec)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  int *__dest;
  long lVar3;
  
  pVVar2 = (Vec_Int_t *)malloc(0x10);
  iVar1 = pVec->nSize;
  lVar3 = (long)iVar1;
  pVVar2->nSize = iVar1;
  pVVar2->nCap = iVar1;
  if (lVar3 == 0) {
    __dest = (int *)0x0;
  }
  else {
    __dest = (int *)malloc(lVar3 * 4);
  }
  pVVar2->pArray = __dest;
  memcpy(__dest,pVec->pArray,lVar3 << 2);
  return pVVar2;
}

Assistant:

static inline Vec_Int_t * Vec_IntDup( Vec_Int_t * pVec )
{
    Vec_Int_t * p;
    p = ABC_ALLOC( Vec_Int_t, 1 );
    p->nSize  = pVec->nSize;
    p->nCap   = pVec->nSize;
    p->pArray = p->nCap? ABC_ALLOC( int, p->nCap ) : NULL;
    memcpy( p->pArray, pVec->pArray, sizeof(int) * (size_t)pVec->nSize );
    return p;
}